

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForParameterAndIgnored_Test::testBody
          (TEST_MockExpectedCall_toStringForParameterAndIgnored_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_f0 [64];
  undefined1 local_b0 [8];
  MockCheckedExpectedCall expectedCall;
  TEST_MockExpectedCall_toStringForParameterAndIgnored_Test *this_local;
  
  expectedCall._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0,1);
  SimpleString::SimpleString((SimpleString *)(local_f0 + 0x30),"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)local_b0,(SimpleString *)(local_f0 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_f0 + 0x30));
  SimpleString::SimpleString((SimpleString *)(local_f0 + 0x10),"string");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)local_b0,(SimpleString *)(local_f0 + 0x10),"value");
  SimpleString::~SimpleString((SimpleString *)(local_f0 + 0x10));
  MockCheckedExpectedCall::ignoreOtherParameters((MockCheckedExpectedCall *)local_b0);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_f0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_f0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const char* string: <value>, other parameters are ignored (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x27a,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_f0);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForParameterAndIgnored)
{
    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.ignoreOtherParameters();
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, other parameters are ignored (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}